

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaValidateStreamInternal(xmlSchemaValidCtxtPtr ctxt,xmlParserCtxtPtr pctxt)

{
  int iVar1;
  xmlSchemaSAXPlugPtr plug;
  
  pctxt->linenumbers = 1;
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    ctxt->locFunc = xmlSchemaValidateStreamLocator;
    ctxt->locCtxt = pctxt;
  }
  ctxt->parserCtxt = pctxt;
  ctxt->input = pctxt->input->buf;
  plug = xmlSchemaSAXPlug(ctxt,&pctxt->sax,&pctxt->userData);
  if (plug == (xmlSchemaSAXPlugPtr)0x0) {
    ctxt->input = (xmlParserInputBufferPtr)0x0;
    ctxt->sax = (xmlSAXHandlerPtr)0x0;
    ctxt->parserCtxt = (xmlParserCtxtPtr)0x0;
    iVar1 = -1;
  }
  else {
    ctxt->input = pctxt->input->buf;
    ctxt->sax = pctxt->sax;
    *(byte *)&ctxt->flags = (byte)ctxt->flags | 1;
    iVar1 = xmlSchemaVStart(ctxt);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (ctxt->parserCtxt->wellFormed == 0) {
        iVar1 = ctxt->parserCtxt->errNo;
        iVar1 = iVar1 + (uint)(iVar1 == 0);
      }
    }
    ctxt->input = (xmlParserInputBufferPtr)0x0;
    ctxt->sax = (xmlSAXHandlerPtr)0x0;
    ctxt->parserCtxt = (xmlParserCtxtPtr)0x0;
    xmlSchemaSAXUnplug(plug);
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaValidateStreamInternal(xmlSchemaValidCtxtPtr ctxt,
                                 xmlParserCtxtPtr pctxt) {
    xmlSchemaSAXPlugPtr plug = NULL;
    int ret;

    pctxt->linenumbers = 1;
    xmlSchemaValidateSetLocator(ctxt, xmlSchemaValidateStreamLocator, pctxt);

    ctxt->parserCtxt = pctxt;
    ctxt->input = pctxt->input->buf;

    /*
     * Plug the validation and launch the parsing
     */
    plug = xmlSchemaSAXPlug(ctxt, &(pctxt->sax), &(pctxt->userData));
    if (plug == NULL) {
        ret = -1;
	goto done;
    }
    ctxt->input = pctxt->input->buf;
    ctxt->sax = pctxt->sax;
    ctxt->flags |= XML_SCHEMA_VALID_CTXT_FLAG_STREAM;
    ret = xmlSchemaVStart(ctxt);

    if ((ret == 0) && (! ctxt->parserCtxt->wellFormed)) {
	ret = ctxt->parserCtxt->errNo;
	if (ret == 0)
	    ret = 1;
    }

done:
    ctxt->parserCtxt = NULL;
    ctxt->sax = NULL;
    ctxt->input = NULL;
    if (plug != NULL) {
        xmlSchemaSAXUnplug(plug);
    }
    return (ret);
}